

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.h
# Opt level: O0

Opcode wabt::Opcode::FromCode(uint8_t prefix,uint32_t code)

{
  uint32_t prefix_code_00;
  Enum e;
  bool local_1d;
  uint32_t value;
  uint32_t prefix_code;
  uint32_t code_local;
  uint8_t prefix_local;
  
  prefix_code_00 = PrefixCode(prefix,code);
  if (prefix_code_00 < 0x20000) {
    local_1d = WabtOpcodeCodeTable[prefix_code_00] != Unreachable || code == 0;
    if (local_1d) {
      Opcode((Opcode *)&code_local,WabtOpcodeCodeTable[prefix_code_00]);
      return (Opcode)code_local;
    }
  }
  e = EncodeInvalidOpcode(prefix_code_00);
  Opcode((Opcode *)&code_local,e);
  return (Opcode)code_local;
}

Assistant:

inline Opcode Opcode::FromCode(uint8_t prefix, uint32_t code) {
  uint32_t prefix_code = PrefixCode(prefix, code);

  if (WABT_LIKELY(prefix_code < WABT_ARRAY_SIZE(WabtOpcodeCodeTable))) {
    uint32_t value = WabtOpcodeCodeTable[prefix_code];
    // The default value in the table is 0. That's a valid value, but only if
    // the code is 0 (for nop).
    if (WABT_LIKELY(value != 0 || code == 0)) {
      return Opcode(static_cast<Enum>(value));
    }
  }

  return Opcode(EncodeInvalidOpcode(prefix_code));
}